

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O2

void __thiscall absl::lts_20250127::uint128::uint128(uint128 *this,longdouble v)

{
  uint64_t uVar1;
  longdouble in_ST0;
  longdouble lVar2;
  longdouble lVar3;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  ushort uStack_30;
  
  uStack_30 = (ushort)((unkuint10)v >> 0x40);
  if (-(longdouble)1 < v) {
    if (((unkuint10)v & 0x7fff) == 0 ||
        ((ushort)((uStack_30 & 0x7fff) - 1) < 0x7ffe & (byte)((unkuint10)v >> 0x38) >> 7) != 0) {
      ldexpl(0x80);
      if (v < in_ST0) {
        ldexpl(0x40);
        if (in_ST1 <= v) {
          ldexpl(0xffffffffffffffc0);
          lVar2 = (longdouble)9.223372e+18;
          lVar3 = (longdouble)0;
          if (lVar2 <= in_ST2) {
            lVar3 = lVar2;
          }
          uVar1 = (ulong)(lVar2 <= in_ST2) << 0x3f ^ (long)ROUND(in_ST2 - lVar3);
          ldexpl(0x40);
          v = v - in_ST3;
        }
        else {
          uVar1 = 0;
        }
        lVar2 = (longdouble)9.223372e+18;
        lVar3 = (longdouble)0;
        if (lVar2 <= v) {
          lVar3 = lVar2;
        }
        this->lo_ = (ulong)(lVar2 <= v) << 0x3f ^ (long)ROUND(v - lVar3);
        this->hi_ = uVar1;
        return;
      }
    }
  }
  __assert_fail("std::isfinite(v) && v > -1 && (std::numeric_limits<T>::max_exponent <= 128 || v < std::ldexp(static_cast<T>(1), 128))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/numeric/int128.cc"
                ,100,
                "uint128 absl::lts_20250127::(anonymous namespace)::MakeUint128FromFloat(T) [T = long double]"
               );
}

Assistant:

uint128::uint128(long double v) : uint128(MakeUint128FromFloat(v)) {}